

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void delete_these_objects(Am_Object *group,Am_Value_List *deleted_objs)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object obj;
  Am_Value_List *deleted_objs_local;
  Am_Object *group_local;
  
  obj.data = (Am_Object_Data *)deleted_objs;
  Am_Object::Am_Object(&local_20);
  Am_Value_List::Start(deleted_objs);
  while( true ) {
    bVar1 = Am_Value_List::Last(deleted_objs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_value = Am_Value_List::Get(deleted_objs);
    Am_Object::operator=(&local_20,in_value);
    Am_Object::Am_Object(local_38,&local_20);
    Am_Object::Remove_Part(group,local_38);
    Am_Object::~Am_Object(local_38);
    Am_Value_List::Next(deleted_objs);
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
delete_these_objects(Am_Object group, Am_Value_List deleted_objs)
{
  Am_Object obj;
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING, "++ `Deleting' objects "
                                                   << deleted_objs
                                                   << " by removing them from "
                                                   << group);
  for (deleted_objs.Start(); !deleted_objs.Last(); deleted_objs.Next()) {
    obj = deleted_objs.Get();
    group.Remove_Part(obj);
  }
}